

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O2

void __thiscall gnilk::LogManager::SendToSinks(LogManager *this)

{
  pointer puVar1;
  LogManager *pLVar2;
  int iVar3;
  LogEvent *this_00;
  undefined4 extraout_var;
  pointer puVar4;
  future<int> future;
  LogSink *sink;
  Ref ipc;
  deque<std::future<int>,_std::allocator<std::future<int>_>_> sinkReadyList;
  future<int> local_c8;
  pthread_mutex_t *local_b8;
  LogManager *local_b0;
  _func_int **local_a8;
  __shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2> local_a0;
  LogSink *local_90;
  _Alloc_hider local_88;
  deque<std::future<int>,std::allocator<std::future<int>>> local_80 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50 [2];
  
  Instance();
  std::__shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_a0,
             &Instance::glbManager.ipcHandler.
              super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>);
  iVar3 = (*((this->ipcHandler).super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_LogIPCBase[4])();
  if ((char)iVar3 != '\0') {
    local_b8 = (pthread_mutex_t *)&this->sinkLock;
    std::mutex::lock((mutex *)&local_b8->__data);
    local_b0 = this;
    while( true ) {
      pLVar2 = local_b0;
      iVar3 = (*((local_b0->ipcHandler).
                 super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_LogIPCBase[4])();
      if ((char)iVar3 == '\0') break;
      this_00 = LogCache::Next((pLVar2->cache).
                               super___shared_ptr<gnilk::LogCache,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
      iVar3 = (*(local_a0._M_ptr)->_vptr_LogIPCBase[6])(local_a0._M_ptr,this_00);
      if (iVar3 < 0) {
        perror("SendToSinks, ipc->ReadEvent failed!");
        break;
      }
      LogEvent::ComposeReportString(this_00);
      std::_Deque_base<std::future<int>,_std::allocator<std::future<int>_>_>::_Deque_base
                ((_Deque_base<std::future<int>,_std::allocator<std::future<int>_>_> *)local_80);
      puVar1 = (pLVar2->sinks).
               super__Vector_base<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar4 = (pLVar2->sinks).
                    super__Vector_base<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1
          ) {
        iVar3 = (*((puVar4->_M_t).
                   super___uniq_ptr_impl<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gnilk::LogSinkInstance_*,_std::default_delete<gnilk::LogSinkInstance>_>
                   .super__Head_base<0UL,_gnilk::LogSinkInstance_*,_false>._M_head_impl)->
                  _vptr_LogSinkInstance[2])();
        local_a8 = (_func_int **)CONCAT44(extraout_var,iVar3);
        if ((*(int *)(local_a8 + 6) <= (int)this_00->level) && (*(char *)(local_a8 + 1) == '\x01'))
        {
          local_90 = (LogSink *)0x29;
          local_88._M_p = (pointer)0x0;
          std::
          async<int(gnilk::LogSink::*)(gnilk::LogEvent_const&),gnilk::LogSink*&,gnilk::LogEvent&>
                    ((type *)&local_c8,&local_90,(LogEvent *)&local_a8);
          std::deque<std::future<int>,std::allocator<std::future<int>>>::
          emplace_back<std::future<int>>(local_80,&local_c8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_c8.super___basic_future<int>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
        }
      }
      while (local_50[0]._M_allocated_capacity != local_80._16_8_) {
        local_c8.super___basic_future<int>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)local_80._16_8_;
        local_c8.super___basic_future<int>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_80._16_8_ + 8);
        *(undefined8 *)(local_80._16_8_ + 8) = 0;
        *(undefined8 *)local_80._16_8_ = 0;
        std::future<int>::get(&local_c8);
        std::deque<std::future<int>,_std::allocator<std::future<int>_>_>::pop_front
                  ((deque<std::future<int>,_std::allocator<std::future<int>_>_> *)local_80);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_c8.super___basic_future<int>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
      std::deque<std::future<int>,_std::allocator<std::future<int>_>_>::~deque
                ((deque<std::future<int>,_std::allocator<std::future<int>_>_> *)local_80);
    }
    pthread_mutex_unlock(local_b8);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
  return;
}

Assistant:

void LogManager::SendToSinks() {
    auto ipc = LogManager::Instance().GetIPC();
    if (!ipcHandler->Available()) {
        return;
    }

    std::lock_guard<std::mutex> lock(sinkLock);

    // Fetch all events from the ipc handler
    while (ipcHandler->Available()) {
        auto logEvent = cache->Next();

        if (ipc->ReadEvent(*logEvent) < 0) {
            // failed
            perror("SendToSinks, ipc->ReadEvent failed!");
            return;
        }

        logEvent->ComposeReportString();    // pre-compose the report string...
        std::deque<std::future<int>> sinkReadyList;

        for (auto &sinkInstance: sinks) {
            // This should not be problematic, except for maybe the unmanaged sink's which potentially could go out of
            // scope while we do this...
            auto sink = sinkInstance->GetSink();

            // Don't even send it unless it is within the range...
            if (!sink->WithinRange(logEvent->level)) {
                continue;
            }
            if (!sink->IsEnabled()) {
                continue;
            }

            auto future = std::async(&LogSink::Write, sink, *logEvent);
            sinkReadyList.push_back(std::move(future));
        }

        while (!sinkReadyList.empty()) {
            auto future = std::move(sinkReadyList.front());
            future.get();
            sinkReadyList.pop_front();
        }
    }
}